

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

bool __thiscall JetHead::Path::append(Path *this,string *path)

{
  if ((this->mPath)._M_dataplus._M_p[(this->mPath)._M_string_length - 1] != '/') {
    std::__cxx11::string::append((ulong)this,'\x01');
  }
  std::__cxx11::string::append((string *)this);
  return true;
}

Assistant:

bool Path::append( const JHSTD::string &path )
{
	if ( mPath[ mPath.length() - 1 ] != PATH_SEPERATOR )
		mPath.append( 1, PATH_SEPERATOR	);
		
	mPath.append( path );
	return true;
}